

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  CURLUcode CVar1;
  char local_38 [4];
  CURLUcode uc;
  char portbuf [16];
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((data->set).use_port != 0) && (((data->state).allow_port & 1U) != 0)) {
    conn->remote_port = (uint)(data->set).use_port & 0xffff;
    curl_msnprintf(local_38,0x10,"%u");
    CVar1 = curl_url_set((data->state).uh,CURLUPART_PORT,local_38,0);
    if (CVar1 != CURLUE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this instead of the port possibly given in the URL */
    char portbuf[16];
    CURLUcode uc;
    conn->remote_port = (unsigned short)data->set.use_port;
    snprintf(portbuf, sizeof(portbuf), "%u", conn->remote_port);
    uc = curl_url_set(data->state.uh, CURLUPART_PORT, portbuf, 0);
    if(uc)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}